

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFObject.cpp
# Opt level: O2

void __thiscall PDFObject::SetMetadata(PDFObject *this,string *inKey,IDeletable *inValue)

{
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDeletable_*>
  pStack_48;
  
  DeleteMetadata(this,inKey);
  std::__cxx11::string::string((string *)&pStack_48,(string *)inKey);
  pStack_48.second = inValue;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,IDeletable*>,std::_Select1st<std::pair<std::__cxx11::string_const,IDeletable*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,IDeletable*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,IDeletable*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,IDeletable*>,std::_Select1st<std::pair<std::__cxx11::string_const,IDeletable*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,IDeletable*>>>
              *)&this->mMetadata,&pStack_48);
  std::__cxx11::string::~string((string *)&pStack_48);
  return;
}

Assistant:

void PDFObject::SetMetadata(const std::string& inKey, IDeletable* inValue) {
	// delete old metadata
	DeleteMetadata(inKey);

	mMetadata.insert(StringToIDeletable::value_type(inKey, inValue));
}